

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ncart.hpp
# Opt level: O2

int NCART(DAM *am)

{
  int iVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  
  iVar2 = 1;
  for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 4) {
    iVar1 = *(int *)((long)(am->dam)._M_elems + lVar3);
    uVar4 = (uint)((iVar1 + 1) * (iVar1 + 2)) >> 1;
    if (iVar1 < 0) {
      uVar4 = 0;
    }
    iVar2 = iVar2 * uVar4;
  }
  return iVar2;
}

Assistant:

inline int NCART(DAM am)
{
    int ncart = 1;

    for(auto & it : am)
        ncart *= NCART_(it);

    return ncart;
}